

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

int calc_offset_proc(Am_Object *self)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object local_60 [8];
  Am_Object parent;
  Am_Value_List local_50 [8];
  Am_Value_List nodes;
  int parent_rank;
  int rank;
  int prev_children;
  int prev_offset;
  Am_Object local_20 [8];
  Am_Object prev_child;
  Am_Object *self_local;
  
  _prev_child = self;
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)PREV_CHILD);
  Am_Object::Am_Object(local_20,pAVar4);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) == 0) {
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)_prev_child,0x85);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)_prev_child,(ulong)PARENT);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    if (iVar2 == iVar3) {
      self_local._4_4_ = 0;
    }
    else {
      Am_Object::Get_Owner(&parent,(Am_Slot_Flags)_prev_child);
      pAVar4 = (Am_Value *)Am_Object::Get((ushort)&parent,0x82);
      Am_Value_List::Am_Value_List(local_50,pAVar4);
      Am_Object::~Am_Object(&parent);
      bVar1 = Am_Value_List::Valid();
      if ((bVar1 & 1) == 0) {
        self_local._4_4_ = 0;
      }
      else {
        pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_50);
        Am_Object::Am_Object(local_60,pAVar4);
        pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_60,(ulong)OFFSET);
        self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar4);
        Am_Object::~Am_Object(local_60);
      }
      Am_Value_List::~Am_Value_List(local_50);
    }
  }
  else {
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_20,(ulong)OFFSET);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_20,(ulong)CHILDREN);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    self_local._4_4_ = iVar2 + iVar3;
  }
  Am_Object::~Am_Object(local_20);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, calc_offset)
{
  Am_Object prev_child = self.Get(PREV_CHILD);
  if (prev_child.Valid()) {
    int prev_offset = prev_child.Get(OFFSET);
    int prev_children = prev_child.Get(CHILDREN);
    return prev_offset + prev_children;
  } else {
    int rank = self.Get(Am_RANK);
    int parent_rank = self.Get(PARENT);
    if (rank == parent_rank)
      return 0;
    Am_Value_List nodes = self.Get_Owner().Get(Am_GRAPHICAL_PARTS);
    if (nodes.Valid()) {
      Am_Object parent = nodes.Get_Nth(parent_rank);
      return parent.Get(OFFSET);
    } else
      return 0;
  }
}